

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O0

bool __thiscall ON_Buffer::IsValid(ON_Buffer *this,ON_TextLog *text_log)

{
  bool bVar1;
  ulong uVar2;
  ON_BUFFER_SEGMENT *local_48;
  ON_BUFFER_SEGMENT *seg;
  ON_BUFFER_SEGMENT *prev_seg;
  ON__UINT64 u;
  ON__UINT64 pos;
  bool bCurrentSegInList;
  ON_TextLog *text_log_local;
  ON_Buffer *this_local;
  
  if (this->m_buffer_size == 0) {
    if (this->m_first_segment == (ON_BUFFER_SEGMENT *)0x0) {
      if (this->m_last_segment == (ON_BUFFER_SEGMENT *)0x0) {
        if (this->m_current_segment == (ON_BUFFER_SEGMENT *)0x0) {
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = ON_Buffer_IsNotValid();
        }
      }
      else {
        this_local._7_1_ = ON_Buffer_IsNotValid();
      }
    }
    else {
      this_local._7_1_ = ON_Buffer_IsNotValid();
    }
  }
  else if (this->m_first_segment == (ON_BUFFER_SEGMENT *)0x0) {
    this_local._7_1_ = ON_Buffer_IsNotValid();
  }
  else if (this->m_first_segment->m_prev_segment == (ON_BUFFER_SEGMENT *)0x0) {
    if (this->m_last_segment == (ON_BUFFER_SEGMENT *)0x0) {
      this_local._7_1_ = ON_Buffer_IsNotValid();
    }
    else if (this->m_last_segment->m_next_segment == (ON_BUFFER_SEGMENT *)0x0) {
      u = 0;
      seg = (ON_BUFFER_SEGMENT *)0x0;
      for (local_48 = this->m_first_segment; local_48 != (ON_BUFFER_SEGMENT *)0x0;
          local_48 = local_48->m_next_segment) {
        if (seg != local_48->m_prev_segment) {
          bVar1 = ON_Buffer_IsNotValid();
          return bVar1;
        }
        if ((seg != (ON_BUFFER_SEGMENT *)0x0) &&
           (seg->m_segment_position1 != local_48->m_segment_position0)) {
          bVar1 = ON_Buffer_IsNotValid();
          return bVar1;
        }
        if (local_48->m_segment_position1 <= local_48->m_segment_position0) {
          bVar1 = ON_Buffer_IsNotValid();
          return bVar1;
        }
        if (u != local_48->m_segment_position0) {
          bVar1 = ON_Buffer_IsNotValid();
          return bVar1;
        }
        uVar2 = u + (local_48->m_segment_position1 - local_48->m_segment_position0);
        if (uVar2 <= u) {
          bVar1 = ON_Buffer_IsNotValid();
          return bVar1;
        }
        seg = local_48;
        u = uVar2;
      }
      if (this->m_last_segment == seg) {
        if (u < this->m_buffer_size) {
          this_local._7_1_ = ON_Buffer_IsNotValid();
        }
        else if ((this->m_last_segment->m_segment_position0 < this->m_buffer_size) &&
                (this->m_buffer_size <= this->m_last_segment->m_segment_position1)) {
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = ON_Buffer_IsNotValid();
        }
      }
      else {
        this_local._7_1_ = ON_Buffer_IsNotValid();
      }
    }
    else {
      this_local._7_1_ = ON_Buffer_IsNotValid();
    }
  }
  else {
    this_local._7_1_ = ON_Buffer_IsNotValid();
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Buffer::IsValid( const ON_TextLog* text_log ) const
{
  // This function is primarily used to discover bugs
  // in the ON_Buffer member function code.

  if ( 0 == m_buffer_size )
  {

    if ( 0 != m_first_segment )
      return ON_Buffer_IsNotValid();
    if ( 0 != m_last_segment )
      return ON_Buffer_IsNotValid();
    if ( 0 != m_current_segment )
      return ON_Buffer_IsNotValid();

    return true;
  }


  if ( 0 == m_first_segment )
    return ON_Buffer_IsNotValid();
  if ( 0 != m_first_segment->m_prev_segment )
    return ON_Buffer_IsNotValid();
  if ( 0 == m_last_segment )
    return ON_Buffer_IsNotValid();
  if ( 0 != m_last_segment->m_next_segment )
    return ON_Buffer_IsNotValid();

  bool bCurrentSegInList = (0 == m_current_segment);
  ON__UINT64 pos = 0;
  ON__UINT64 u;
  const struct ON_BUFFER_SEGMENT* prev_seg = 0;
  const struct ON_BUFFER_SEGMENT* seg;
  for ( seg = m_first_segment; seg != 0; seg = seg->m_next_segment )
  {
    if ( prev_seg != seg->m_prev_segment )
      return ON_Buffer_IsNotValid();
    if ( 0 != prev_seg && prev_seg->m_segment_position1 != seg->m_segment_position0 )
      return ON_Buffer_IsNotValid();
    if ( seg->m_segment_position1 <= seg->m_segment_position0 )
      return ON_Buffer_IsNotValid();
    if ( pos != seg->m_segment_position0 )
      return ON_Buffer_IsNotValid();

    if ( m_current_segment == seg )
      bCurrentSegInList = true;

    // pos checks prevent infinite loop when the linked list has a cycle;
    u = pos + (seg->m_segment_position1 - seg->m_segment_position0);
    if ( pos >= u )
      return ON_Buffer_IsNotValid(); // addition wrapped value
    pos = u;
    prev_seg = seg;
  }

  if ( m_last_segment != prev_seg )
    return ON_Buffer_IsNotValid();

  if ( pos < m_buffer_size )
    return ON_Buffer_IsNotValid();

  if (    m_buffer_size <= m_last_segment->m_segment_position0 
       || m_buffer_size > m_last_segment->m_segment_position1 
     )
    return ON_Buffer_IsNotValid();

  return true;
}